

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O3

uint8_t * WebPIDecGetRGB(WebPIDecoder *idec,int *last_y,int *width,int *height,int *stride)

{
  WebPDecBuffer *pWVar1;
  
  if ((((idec != (WebPIDecoder *)0x0) && (idec->dec != (void *)0x0)) &&
      (STATE_VP8_PARTS0 < idec->state)) &&
     (((idec->final_output == (WebPDecBuffer *)0x0 &&
       (pWVar1 = (idec->params).output, pWVar1 != (WebPDecBuffer *)0x0)) &&
      (pWVar1->colorspace < MODE_YUV)))) {
    if (last_y != (int *)0x0) {
      *last_y = (idec->params).last_y;
    }
    if (width != (int *)0x0) {
      *width = pWVar1->width;
    }
    if (height != (int *)0x0) {
      *height = pWVar1->height;
    }
    if (stride != (int *)0x0) {
      *stride = (pWVar1->u).RGBA.stride;
    }
    return (pWVar1->u).RGBA.rgba;
  }
  return (uint8_t *)0x0;
}

Assistant:

WEBP_NODISCARD uint8_t* WebPIDecGetRGB(const WebPIDecoder* idec, int* last_y,
                                       int* width, int* height, int* stride) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (src == NULL) return NULL;
  if (src->colorspace >= MODE_YUV) {
    return NULL;
  }

  if (last_y != NULL) *last_y = idec->params.last_y;
  if (width != NULL) *width = src->width;
  if (height != NULL) *height = src->height;
  if (stride != NULL) *stride = src->u.RGBA.stride;

  return src->u.RGBA.rgba;
}